

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallExportGenerator::cmInstallExportGenerator
          (cmInstallExportGenerator *this,cmExportSet *exportSet,char *destination,
          char *file_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,char *component,MessageLevel message,char *filename,char *name_space,
          bool exportOld)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmExportInstallFileGenerator *this_00;
  allocator local_4e;
  allocator local_4d [19];
  allocator local_3a;
  byte local_39;
  char *pcStack_38;
  bool exportOld_local;
  char *component_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations_local;
  char *file_permissions_local;
  char *destination_local;
  cmExportSet *exportSet_local;
  cmInstallExportGenerator *this_local;
  
  local_39 = exportOld;
  pcStack_38 = component;
  component_local = (char *)configurations;
  configurations_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)file_permissions;
  file_permissions_local = destination;
  destination_local = (char *)exportSet;
  exportSet_local = (cmExportSet *)this;
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,destination,configurations,component,message);
  pvVar1 = configurations_local;
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallExportGenerator_00a7e5e8;
  this->ExportSet = (cmExportSet *)destination_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->FilePermissions,(char *)pvVar1,&local_3a);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->FileName,filename,local_4d);
  std::allocator<char>::~allocator((allocator<char> *)local_4d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->Namespace,name_space,&local_4e);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e);
  this->ExportOld = (bool)(local_39 & 1);
  this->LocalGenerator = (cmLocalGenerator *)0x0;
  std::__cxx11::string::string((string *)&this->TempDir);
  std::__cxx11::string::string((string *)&this->MainImportFile);
  this_00 = (cmExportInstallFileGenerator *)operator_new(0x138);
  cmExportInstallFileGenerator::cmExportInstallFileGenerator(this_00,this);
  this->EFGen = this_00;
  cmExportSet::AddInstallation((cmExportSet *)destination_local,this);
  return;
}

Assistant:

cmInstallExportGenerator::cmInstallExportGenerator(
  cmExportSet* exportSet,
  const char* destination,
  const char* file_permissions,
  std::vector<std::string> const& configurations,
  const char* component,
  MessageLevel message,
  const char* filename, const char* name_space,
  bool exportOld)
  :cmInstallGenerator(destination, configurations, component, message)
  ,ExportSet(exportSet)
  ,FilePermissions(file_permissions)
  ,FileName(filename)
  ,Namespace(name_space)
  ,ExportOld(exportOld)
  ,LocalGenerator(0)
{
  this->EFGen = new cmExportInstallFileGenerator(this);
  exportSet->AddInstallation(this);
}